

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

void trompeloeil::missed_value<trompeloeil::wildcard>(ostream *os,int i,wildcard *t)

{
  _Setw _Var1;
  ostream *poVar2;
  char *pcVar3;
  string local_60;
  undefined1 local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> prefix;
  wildcard *t_local;
  int i_local;
  ostream *os_local;
  
  prefix.field_2._8_8_ = t;
  param_name_prefix_abi_cxx11_(&local_60,(trompeloeil *)t,t);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,"_");
  std::__cxx11::string::~string((string *)&local_60);
  poVar2 = std::operator<<(os,"  param ");
  _Var1 = std::setw((i < 9) + 1);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = std::operator<<(poVar2,(string *)local_40);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,i + 1);
  pcVar3 = param_compare_operator((matcher *)prefix.field_2._8_8_);
  std::operator<<(poVar2,pcVar3);
  print<trompeloeil::wildcard>(os,(wildcard *)prefix.field_2._8_8_);
  std::operator<<(os,'\n');
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void missed_value(
    std::ostream& os,
    int i,
    T const& t)
  {
    auto prefix = ::trompeloeil::param_name_prefix(&t) + "_";
    os << "  param " << std::setw((i < 9) ? 2 : 1) << prefix << i + 1
       << ::trompeloeil::param_compare_operator(&t);
    ::trompeloeil::print(os, t);
    os << '\n';
  }